

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ModportItemSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ModportItemSyntax,slang::syntax::ModportItemSyntax_const&>
          (BumpAllocator *this,ModportItemSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  AnsiPortListSyntax *pAVar3;
  TokenKind TVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  SyntaxKind SVar8;
  undefined4 uVar9;
  ModportItemSyntax *pMVar10;
  
  pMVar10 = (ModportItemSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ModportItemSyntax *)this->endPtr < pMVar10 + 1) {
    pMVar10 = (ModportItemSyntax *)allocateSlow(this,0x30,8);
  }
  else {
    this->head->current = (byte *)(pMVar10 + 1);
  }
  SVar8 = (args->super_SyntaxNode).kind;
  uVar9 = *(undefined4 *)&(args->super_SyntaxNode).field_0x4;
  pSVar1 = (args->super_SyntaxNode).parent;
  pSVar2 = (args->super_SyntaxNode).previewNode;
  TVar4 = (args->name).kind;
  uVar5 = (args->name).field_0x2;
  NVar6.raw = (args->name).numFlags.raw;
  uVar7 = (args->name).rawLen;
  pAVar3 = (args->ports).ptr;
  (pMVar10->name).info = (args->name).info;
  (pMVar10->ports).ptr = pAVar3;
  (pMVar10->super_SyntaxNode).previewNode = pSVar2;
  (pMVar10->name).kind = TVar4;
  (pMVar10->name).field_0x2 = uVar5;
  (pMVar10->name).numFlags = (NumericTokenFlags)NVar6.raw;
  (pMVar10->name).rawLen = uVar7;
  (pMVar10->super_SyntaxNode).kind = SVar8;
  *(undefined4 *)&(pMVar10->super_SyntaxNode).field_0x4 = uVar9;
  (pMVar10->super_SyntaxNode).parent = pSVar1;
  return pMVar10;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }